

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsscene.cpp
# Opt level: O1

bool __thiscall QGraphicsScene::focusNextPrevChild(QGraphicsScene *this,bool next)

{
  long lVar1;
  QGraphicsItem *this_00;
  bool bVar2;
  GraphicsItemFlags GVar3;
  FocusPolicy FVar4;
  QGraphicsWidget *pQVar5;
  QGraphicsItem *pQVar6;
  long lVar7;
  long *plVar8;
  QGraphicsWidget *pQVar9;
  QGraphicsScenePrivate *d;
  
  lVar1 = *(long *)(this + 8);
  this_00 = *(QGraphicsItem **)(lVar1 + 0x188 + (ulong)(*(int *)(lVar1 + 0x1b8) < 1) * 0x10);
  if (this_00 == (QGraphicsItem *)0x0) {
    if ((*(QGraphicsItem **)(lVar1 + 400) != (QGraphicsItem *)0x0) &&
       (bVar2 = QGraphicsItem::isWidget(*(QGraphicsItem **)(lVar1 + 400)), !bVar2)) {
      pQVar6 = *(QGraphicsItem **)(lVar1 + 400);
LAB_0061ba4e:
      setFocusItem(this,pQVar6,BacktabFocusReason - next);
      return true;
    }
    if (*(QGraphicsItem **)(lVar1 + 0x1a8) != (QGraphicsItem *)0x0) {
      GVar3 = QGraphicsItem::flags(*(QGraphicsItem **)(lVar1 + 0x1a8));
      pQVar6 = *(QGraphicsItem **)(lVar1 + 0x1a8);
      if (((uint)GVar3.super_QFlagsStorageHelper<QGraphicsItem::GraphicsItemFlag,_4>.
                 super_QFlagsStorage<QGraphicsItem::GraphicsItemFlag>.i & 4) != 0)
      goto LAB_0061ba4e;
      bVar2 = QGraphicsItem::isWidget(pQVar6);
      if (bVar2) {
        lVar7 = *(long *)(lVar1 + 0x1a8) + -0x10;
        if (*(long *)(lVar1 + 0x1a8) == 0) {
          lVar7 = 0;
        }
        pQVar9 = *(QGraphicsWidget **)(*(long *)(lVar7 + 0x18) + 0x1c0 + (ulong)!next * 8);
        do {
          FVar4 = QGraphicsWidget::focusPolicy(pQVar9);
          if ((FVar4 & TabFocus) != NoFocus) {
            QGraphicsItem::setFocus((QGraphicsItem *)(pQVar9 + 0x10),BacktabFocusReason - next);
            break;
          }
          pQVar9 = *(QGraphicsWidget **)(*(long *)(pQVar9 + 0x18) + (ulong)!next * 8 + 0x1c0);
          pQVar5 = pQVar9 + 0x10;
          if (pQVar9 == (QGraphicsWidget *)0x0) {
            pQVar5 = (QGraphicsWidget *)0x0;
          }
        } while (pQVar5 != *(QGraphicsWidget **)(lVar1 + 0x1a8));
        if ((FVar4 & TabFocus) != NoFocus) {
          return true;
        }
      }
    }
    if (*(long *)(lVar1 + 0x1a0) == 0) {
      return false;
    }
    if (next) {
      plVar8 = (long *)(lVar1 + 0x1a0);
    }
    else {
      plVar8 = (long *)(*(long *)(*(long *)(lVar1 + 0x1a0) + 0x18) + 0x1c8);
    }
    pQVar9 = (QGraphicsWidget *)*plVar8;
    goto LAB_0061baca;
  }
  bVar2 = QGraphicsItem::isWidget(this_00);
  if (!bVar2) {
    return false;
  }
  pQVar9 = *(QGraphicsWidget **)
            ((long)((this_00->d_ptr).d[1].sceneTransform.m_matrix + -5) + (ulong)!next * 8);
  pQVar6 = QGraphicsItem::panel((QGraphicsItem *)(pQVar9 + 0x10));
  if (pQVar6 == (QGraphicsItem *)0x0) {
    if (next) {
      if (pQVar9 != *(QGraphicsWidget **)(lVar1 + 0x1a0)) {
        if (next) goto LAB_0061bac0;
        goto LAB_0061bbb0;
      }
    }
    else {
LAB_0061bbb0:
      if (pQVar9 != *(QGraphicsWidget **)(*(long *)(*(long *)(lVar1 + 0x1a0) + 0x18) + 0x1c8))
      goto LAB_0061bac0;
    }
    bVar2 = false;
  }
  else {
LAB_0061bac0:
    bVar2 = true;
  }
  if (!bVar2) {
    return false;
  }
LAB_0061baca:
  pQVar5 = pQVar9;
  do {
    while( true ) {
      pQVar6 = (QGraphicsItem *)(pQVar5 + 0x10);
      GVar3 = QGraphicsItem::flags(pQVar6);
      if ((((((uint)GVar3.super_QFlagsStorageHelper<QGraphicsItem::GraphicsItemFlag,_4>.
                    super_QFlagsStorage<QGraphicsItem::GraphicsItemFlag>.i & 4) != 0) &&
           (bVar2 = QGraphicsItem::isEnabled(pQVar6), bVar2)) &&
          (bVar2 = QGraphicsItem::isVisibleTo(pQVar6,(QGraphicsItem *)0x0), bVar2)) &&
         ((FVar4 = QGraphicsWidget::focusPolicy(pQVar5), (FVar4 & TabFocus) != NoFocus &&
          (((this_00 == (QGraphicsItem *)0x0 || (bVar2 = QGraphicsItem::isPanel(this_00), !bVar2))
           || (bVar2 = QGraphicsItem::isAncestorOf(this_00,pQVar6), bVar2)))))) {
        QGraphicsItem::setFocus(pQVar6,BacktabFocusReason - next);
        return true;
      }
      pQVar5 = *(QGraphicsWidget **)(*(long *)(pQVar5 + 0x18) + (ulong)!next * 8 + 0x1c0);
      if (next) break;
LAB_0061bb6d:
      if (pQVar5 == *(QGraphicsWidget **)(*(long *)(*(long *)(lVar1 + 0x1a0) + 0x18) + 0x1c8)) {
        return false;
      }
      if (pQVar5 == pQVar9) {
        return false;
      }
    }
    if (pQVar5 == *(QGraphicsWidget **)(lVar1 + 0x1a0)) {
      return false;
    }
    if (!next) goto LAB_0061bb6d;
    if (pQVar5 == pQVar9) {
      return false;
    }
  } while( true );
}

Assistant:

bool QGraphicsScene::focusNextPrevChild(bool next)
{
    Q_D(QGraphicsScene);

    QGraphicsItem *item = focusItem();
    if (item && !item->isWidget()) {
        // Tab out of the scene.
        return false;
    }
    if (!item) {
        if (d->lastFocusItem && !d->lastFocusItem->isWidget()) {
            // Restore focus to the last focusable non-widget item that had
            // focus.
            setFocusItem(d->lastFocusItem, next ? Qt::TabFocusReason : Qt::BacktabFocusReason);
            return true;
        }
        if (d->activePanel) {
            if (d->activePanel->flags() & QGraphicsItem::ItemIsFocusable) {
                setFocusItem(d->activePanel, next ? Qt::TabFocusReason : Qt::BacktabFocusReason);
                return true;
            }
            if (d->activePanel->isWidget()) {
                QGraphicsWidget *test = static_cast<QGraphicsWidget *>(d->activePanel);
                QGraphicsWidget *fw = next ? test->d_func()->focusNext : test->d_func()->focusPrev;
                do {
                    if (fw->focusPolicy() & Qt::TabFocus) {
                        setFocusItem(fw, next ? Qt::TabFocusReason : Qt::BacktabFocusReason);
                        return true;
                    }
                    fw = next ? fw->d_func()->focusNext : fw->d_func()->focusPrev;
                } while (fw != d->activePanel);
            }
        }
    }
    if (!item && !d->tabFocusFirst) {
        // No widgets...
        return false;
    }

    // The item must be a widget.
    QGraphicsWidget *widget = nullptr;
    if (!item) {
        widget = next ? d->tabFocusFirst : d->tabFocusFirst->d_func()->focusPrev;
    } else {
        QGraphicsWidget *test = static_cast<QGraphicsWidget *>(item);
        widget = next ? test->d_func()->focusNext : test->d_func()->focusPrev;
        if (!widget->panel() && ((next && widget == d->tabFocusFirst) || (!next && widget == d->tabFocusFirst->d_func()->focusPrev))) {
            // Tab out of the scene.
            return false;
        }
    }
    QGraphicsWidget *widgetThatHadFocus = widget;

    // Run around the focus chain until we find a widget that can take tab focus.
    do {
        if (widget->flags() & QGraphicsItem::ItemIsFocusable
            && widget->isEnabled() && widget->isVisibleTo(nullptr)
            && (widget->focusPolicy() & Qt::TabFocus)
            && (!item || !item->isPanel() || item->isAncestorOf(widget))
            ) {
            setFocusItem(widget, next ? Qt::TabFocusReason : Qt::BacktabFocusReason);
            return true;
        }
        widget = next ? widget->d_func()->focusNext : widget->d_func()->focusPrev;
        if ((next && widget == d->tabFocusFirst) || (!next && widget == d->tabFocusFirst->d_func()->focusPrev))
            return false;
    } while (widget != widgetThatHadFocus);

    return false;
}